

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O3

int __thiscall despot::Pocman::MakeObservations(Pocman *this,PocmanState *pocstate)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  int d;
  int action;
  uint uVar4;
  uint uVar5;
  Coord wpos;
  ulong local_38;
  
  action = 0;
  uVar5 = 0;
  do {
    iVar2 = SeeGhost(this,pocstate,action);
    uVar4 = 1 << ((byte)action & 0x1f);
    if (iVar2 < 0) {
      uVar4 = 0;
    }
    uVar5 = uVar4 | uVar5;
    local_38 = NextPos(this,&pocstate->pocman_pos,action);
    if ((local_38 & 0x8000000080000000) == 0) {
      pbVar3 = (byte *)Grid<int>::operator()(&this->maze_,(Coord *)&local_38);
      if ((*pbVar3 & 1) != 0) {
        uVar5 = uVar5 | 0x10 << ((byte)action & 0x1f);
      }
    }
    action = action + 1;
  } while (action != 4);
  bVar1 = SmellFood(this,pocstate);
  uVar4 = uVar5 | 0x100;
  if (!bVar1) {
    uVar4 = uVar5;
  }
  bVar1 = HearGhost(this,pocstate);
  uVar5 = uVar4 | 0x200;
  if (!bVar1) {
    uVar5 = uVar4;
  }
  return uVar5;
}

Assistant:

int Pocman::MakeObservations(const PocmanState& pocstate) const {
	int observation = 0;
	for (int d = 0; d < 4; d++) {
		if (SeeGhost(pocstate, d) >= 0)
			SetFlag(observation, d);
		Coord wpos = NextPos(pocstate.pocman_pos, d);
		if (wpos.x >= 0 && wpos.y >= 0 && Passable(wpos))
			SetFlag(observation, d + 4);
	}
	if (SmellFood(pocstate))
		SetFlag(observation, 8);
	if (HearGhost(pocstate))
		SetFlag(observation, 9);
	return observation;
}